

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

class_spell_conflict * spell_by_index(player *p,wchar_t index)

{
  player_class *ppVar1;
  class_magic_conflict *magic;
  int local_20;
  wchar_t count;
  wchar_t book;
  wchar_t index_local;
  player *p_local;
  
  local_20 = 0;
  magic._4_4_ = 0;
  ppVar1 = p->class;
  if ((index < L'\0') || ((ppVar1->magic).total_spells <= index)) {
    p_local = (player *)0x0;
  }
  else {
    while (magic._4_4_ + (ppVar1->magic).books[local_20].num_spells + L'\xffffffff' < index) {
      magic._4_4_ = (ppVar1->magic).books[local_20].num_spells + magic._4_4_;
      local_20 = local_20 + 1;
    }
    p_local = (player *)((ppVar1->magic).books[local_20].spells + (index - magic._4_4_));
  }
  return (class_spell_conflict *)p_local;
}

Assistant:

const struct class_spell *spell_by_index(const struct player *p, int index)
{
	int book = 0, count = 0;
	const struct class_magic *magic = &p->class->magic;

	/* Check index validity */
	if (index < 0 || index >= magic->total_spells)
		return NULL;

	/* Find the book, count the spells in previous books */
	while (count + magic->books[book].num_spells - 1 < index)
		count += magic->books[book++].num_spells;

	/* Find the spell */
	return &magic->books[book].spells[index - count];
}